

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O2

uint64_t Hacl_FFDHE_ffdhe_shared_secret(Spec_FFDHE_ffdhe_alg a,uint8_t *sk,uint8_t *pk,uint8_t *ss)

{
  size_t __n;
  long lVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t *p_r2_n;
  uint64_t auStack_40 [2];
  
  auStack_40[0] = 0x14bb31;
  uVar2 = ffdhe_len(a);
  __n = (ulong)(uVar2 - 1 >> 2 & 0xfffffffe) * 8 + 0x10;
  lVar1 = -__n;
  p_r2_n = (uint64_t *)((long)auStack_40 + lVar1 + 8);
  *(undefined8 *)((long)auStack_40 + lVar1) = 0x14bb54;
  memset(p_r2_n,0,__n);
  *(undefined8 *)((long)auStack_40 + lVar1) = 0x14bb5f;
  ffdhe_precomp_p(a,p_r2_n);
  *(undefined8 *)((long)auStack_40 + lVar1) = 0x14bb73;
  uVar3 = Hacl_FFDHE_ffdhe_shared_secret_precomp(a,p_r2_n,sk,pk,ss);
  return uVar3;
}

Assistant:

uint64_t
Hacl_FFDHE_ffdhe_shared_secret(Spec_FFDHE_ffdhe_alg a, uint8_t *sk, uint8_t *pk, uint8_t *ss)
{
  uint32_t len = ffdhe_len(a);
  uint32_t nLen = (len - 1U) / 8U + 1U;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen + nLen);
  uint64_t p_n[nLen + nLen];
  memset(p_n, 0U, (nLen + nLen) * sizeof (uint64_t));
  ffdhe_precomp_p(a, p_n);
  uint64_t m = Hacl_FFDHE_ffdhe_shared_secret_precomp(a, p_n, sk, pk, ss);
  return m;
}